

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlACatalogResolveURI(xmlCatalogPtr catal,xmlChar *URI)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  
  if (catal == (xmlCatalogPtr)0x0 || URI == (xmlChar *)0x0) {
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Resolve URI %s\n");
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar1 = xmlCatalogListXMLResolveURI(catal->xml,URI);
      pxVar2 = (xmlChar *)0x0;
      if (pxVar1 != (xmlChar *)0xffffffffffffffff) {
        pxVar2 = pxVar1;
      }
    }
    else {
      pxVar1 = xmlCatalogSGMLResolve(catal,(xmlChar *)0x0,URI);
      pxVar2 = (xmlChar *)0x0;
      if (pxVar1 != (xmlChar *)0x0) {
        pxVar2 = xmlStrdup(pxVar1);
        return pxVar2;
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlChar *
xmlACatalogResolveURI(xmlCatalogPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;

    if ((URI == NULL) || (catal == NULL))
	return(NULL);

    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Resolve URI %s\n", URI);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	ret = xmlCatalogListXMLResolveURI(catal->xml, URI);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
	const xmlChar *sgml;

	sgml = xmlCatalogSGMLResolve(catal, NULL, URI);
	if (sgml != NULL)
            ret = xmlStrdup(sgml);
    }
    return(ret);
}